

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_subdiv_mesh.cpp
# Opt level: O3

void __thiscall embree::SubdivMesh::Topology::updateHalfEdges(Topology *this)

{
  SubdivMesh *pSVar1;
  pointer pKVar2;
  Topology *pTVar3;
  _func_int **pp_Var4;
  char cVar5;
  int iVar6;
  task *ptVar7;
  runtime_error *this_00;
  bool updateEdgeCreases;
  bool updateLevels;
  bool updateVertexCreases;
  task_group_context context;
  undefined1 local_e3;
  undefined1 local_e2;
  undefined1 local_e1;
  small_object_pool *local_e0;
  Topology *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  mvector<HalfEdge> *local_c0;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  wait_context local_a0;
  task_group_context local_90;
  
  pSVar1 = this->mesh;
  pKVar2 = (this->halfEdges0).
           super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar3 = (pSVar1->topology).items;
  if ((this->halfEdges0).
      super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
      ._M_impl.super__Vector_impl_data._M_finish != pKVar2) {
    (this->halfEdges0).
    super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
    ._M_impl.super__Vector_impl_data._M_finish = pKVar2;
  }
  pKVar2 = (this->halfEdges1).
           super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->halfEdges1).
      super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
      ._M_impl.super__Vector_impl_data._M_finish != pKVar2) {
    (this->halfEdges1).
    super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
    ._M_impl.super__Vector_impl_data._M_finish = pKVar2;
  }
  if ((((pSVar1->topology).items)->vertexIndices).super_RawBufferView.modified == false) {
    local_e1 = 1;
    local_e3 = 1;
    if ((pSVar1->edge_creases).super_RawBufferView.modified == false) {
      local_e3 = (pSVar1->edge_crease_weights).super_RawBufferView.modified;
    }
    if ((pSVar1->vertex_creases).super_RawBufferView.modified == false) {
      local_e1 = (pSVar1->vertex_crease_weights).super_RawBufferView.modified;
    }
  }
  else {
    local_e3 = 1;
    local_e1 = 1;
  }
  local_c0 = &pTVar3->halfEdges;
  local_b8 = &local_e1;
  local_e2 = (pSVar1->levels).super_RawBufferView.modified;
  local_d0 = &local_e2;
  pp_Var4 = (_func_int **)pSVar1->numHalfEdges;
  local_c8 = &local_e3;
  local_90.my_version = proxy_support;
  local_90.my_traits = (context_traits)0x4;
  local_90.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_90.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_90.my_name = CUSTOM_CTX;
  local_d8 = this;
  tbb::detail::r1::initialize(&local_90);
  if (pp_Var4 != (_func_int **)0x0) {
    local_e0 = (small_object_pool *)0x0;
    ptVar7 = (task *)tbb::detail::r1::allocate(&local_e0,0x80);
    ptVar7->m_reserved[3] = 0;
    ptVar7->m_reserved[4] = 0;
    ptVar7->m_reserved[1] = 0;
    ptVar7->m_reserved[2] = 0;
    (ptVar7->super_task_traits).m_version_and_traits = 0;
    ptVar7->m_reserved[0] = 0;
    ptVar7->m_reserved[5] = 0;
    ptVar7->_vptr_task = (_func_int **)&PTR__task_02191940;
    ptVar7[1]._vptr_task = pp_Var4;
    ptVar7[1].super_task_traits.m_version_and_traits = 0;
    ptVar7[1].m_reserved[0] = 0x1000;
    ptVar7[1].m_reserved[1] = (uint64_t)&local_d8;
    iVar6 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    *(undefined4 *)(ptVar7[1].m_reserved + 4) = 0;
    *(undefined1 *)((long)ptVar7[1].m_reserved + 0x24) = 5;
    ptVar7[1].m_reserved[3] = (long)iVar6 * 2 & 0x7ffffffffffffffe;
    ptVar7[1].m_reserved[5] = (uint64_t)local_e0;
    local_b0 = 0;
    local_a8 = 1;
    local_a0.m_version_and_traits = 1;
    local_a0.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
    ptVar7[1].m_reserved[2] = (uint64_t)&local_b0;
    tbb::detail::r1::execute_and_wait(ptVar7,&local_90,&local_a0,&local_90);
  }
  cVar5 = tbb::detail::r1::is_group_execution_cancelled(&local_90);
  if (cVar5 == '\0') {
    tbb::detail::r1::destroy(&local_90);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SubdivMesh::Topology::updateHalfEdges()
  {
    /* we always use the geometry topology to lookup creases */
    mvector<HalfEdge>& halfEdgesGeom = mesh->topology[0].halfEdges;

    /* assume we do no longer recalculate in the future and clear these arrays */
    halfEdges0.clear();
    halfEdges1.clear();

    /* calculate which data to update */
    const bool updateEdgeCreases   = mesh->topology[0].vertexIndices.isLocalModified() || mesh->edge_creases.isLocalModified()   || mesh->edge_crease_weights.isLocalModified();
    const bool updateVertexCreases = mesh->topology[0].vertexIndices.isLocalModified() || mesh->vertex_creases.isLocalModified() || mesh->vertex_crease_weights.isLocalModified(); 
    const bool updateLevels = mesh->levels.isLocalModified();

    /* parallel loop over all half edges */
    parallel_for( size_t(0), mesh->numHalfEdges, size_t(4096), [&](const range<size_t>& r) 
    {
      for (size_t i=r.begin(); i!=r.end(); i++)
      {
	HalfEdge& edge = halfEdges[i];

	if (updateLevels)
	  edge.edge_level = mesh->getEdgeLevel(i); 
        
	if (updateEdgeCreases) {
	  if (edge.hasOpposite()) // leave weight at inf for borders
            edge.edge_crease_weight = mesh->edgeCreaseMap->edgeCreaseMap.lookup((uint64_t)halfEdgesGeom[i].getEdge(),0.0f);
	}
        
        /* we only use user specified vertex_crease_weight if the vertex is manifold */
        if (updateVertexCreases && edge.vertex_type != HalfEdge::NON_MANIFOLD_EDGE_VERTEX) 
        {
	  edge.vertex_crease_weight = mesh->vertexCreaseMap->vertexCreaseMap.lookup(halfEdgesGeom[i].vtx_index,0.0f);

          /* pin corner vertices when requested by user */
          if (subdiv_mode == RTC_SUBDIVISION_MODE_PIN_CORNERS && edge.isCorner())
            edge.vertex_crease_weight = float(inf);
          
          /* pin all border vertices when requested by user */
          else if (subdiv_mode == RTC_SUBDIVISION_MODE_PIN_BOUNDARY && edge.vertexHasBorder()) 
            edge.vertex_crease_weight = float(inf);

          /* pin every vertex when requested by user */
          else if (subdiv_mode == RTC_SUBDIVISION_MODE_PIN_ALL) {
            edge.edge_crease_weight = float(inf);
            edge.vertex_crease_weight = float(inf);
          }
        }

        /* update patch type */
        if (updateEdgeCreases || updateVertexCreases) {
          edge.patch_type = edge.patchType();
        }
      }
    });
  }